

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void nn_pipebase_received(nn_pipebase *self)

{
  if (self->instate == '\x02') {
    self->instate = '\x03';
    return;
  }
  if (self->instate == '\x04') {
    self->instate = '\x01';
    nn_fsm_raise(&self->fsm,&self->in,0x84c3);
    return;
  }
  nn_pipebase_received_cold_1();
}

Assistant:

void nn_pipebase_received (struct nn_pipebase *self)
{
    if (nn_fast (self->instate == NN_PIPEBASE_INSTATE_RECEIVING)) {
        self->instate = NN_PIPEBASE_INSTATE_RECEIVED;
        return;
    }
    nn_assert (self->instate == NN_PIPEBASE_INSTATE_ASYNC);
    self->instate = NN_PIPEBASE_INSTATE_IDLE;
    nn_fsm_raise (&self->fsm, &self->in, NN_PIPE_IN);
}